

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::NewArrayExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,NewArrayExpressionSyntax *this,size_t index)

{
  __index_type _Var1;
  ParenthesizedExpressionSyntax *pPVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    pPVar2 = (ParenthesizedExpressionSyntax *)(this->newKeyword).ptr;
    break;
  case 1:
    uVar3._0_2_ = (this->openBracket).kind;
    uVar3._2_1_ = (this->openBracket).field_0x2;
    uVar3._3_1_ = (this->openBracket).numFlags;
    uVar4 = (this->openBracket).rawLen;
    uVar5 = *(undefined4 *)&(this->openBracket).info;
    uVar6 = *(undefined4 *)((long)&(this->openBracket).info + 4);
    goto LAB_0021d4a5;
  case 2:
    pPVar2 = (ParenthesizedExpressionSyntax *)(this->sizeExpr).ptr;
    break;
  case 3:
    uVar3._0_2_ = (this->closeBracket).kind;
    uVar3._2_1_ = (this->closeBracket).field_0x2;
    uVar3._3_1_ = (this->closeBracket).numFlags;
    uVar4 = (this->closeBracket).rawLen;
    uVar5 = *(undefined4 *)&(this->closeBracket).info;
    uVar6 = *(undefined4 *)((long)&(this->closeBracket).info + 4);
LAB_0021d4a5:
    *(undefined4 *)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3
    ;
    *(uint32_t *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 4) = uVar4;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 8) = uVar5;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 0xc) = uVar6;
LAB_0021d4b2:
    _Var1 = '\0';
    goto LAB_0021d4b4;
  case 4:
    pPVar2 = this->initializer;
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_0021d4b2;
  }
  *(ParenthesizedExpressionSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pPVar2;
  _Var1 = '\x01';
LAB_0021d4b4:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax NewArrayExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return newKeyword.get();
        case 1: return openBracket;
        case 2: return sizeExpr.get();
        case 3: return closeBracket;
        case 4: return initializer;
        default: return nullptr;
    }
}